

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.h
# Opt level: O2

void __thiscall enact::BasicTypename::~BasicTypename(BasicTypename *this)

{
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__BasicTypename_00124890;
  std::__cxx11::string::~string((string *)&(this->m_where).lexeme);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

~BasicTypename() override = default;